

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_decals.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_Decal::CImpl::VectorAcross(ON_3dVector *__return_storage_ptr__,CImpl *this)

{
  bool bVar1;
  ON_XMLVariant local_218;
  ON_XMLVariant local_120;
  ON_3dPoint local_28;
  CImpl *local_10;
  CImpl *this_local;
  
  local_10 = this;
  bVar1 = ON_3dVector::operator==(&ON_3dVector::UnsetVector,&(this->_cache).vector_across);
  if (bVar1) {
    ::ON_XMLVariant::ON_XMLVariant(&local_218,&ON_3dPoint::Origin);
    GetParameter(&local_120,this,L"vector-across",&local_218);
    ::ON_XMLVariant::As3dPoint(&local_28,&local_120);
    ON_3dVector::operator=(&(this->_cache).vector_across,&local_28);
    ::ON_XMLVariant::~ON_XMLVariant(&local_120);
    ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  }
  __return_storage_ptr__->x = (this->_cache).vector_across.x;
  __return_storage_ptr__->y = (this->_cache).vector_across.y;
  __return_storage_ptr__->z = (this->_cache).vector_across.z;
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Decal::CImpl::VectorAcross(void) const
{
  if (ON_3dVector::UnsetVector == _cache.vector_across)
  {
     _cache.vector_across = GetParameter(ON_RDK_DECAL_VECTOR_ACROSS, ON_3dPoint::Origin).As3dPoint();
  }

  return _cache.vector_across;
}